

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O2

void __thiscall Liby::Buffer::deepCopy(Buffer *this,Buffer *that)

{
  ulong uVar1;
  char *__dest;
  char *__src;
  size_t __n;
  off_t oVar2;
  ulong uVar3;
  
  if (this != that) {
    if (that->leftIndex_ == that->rightIndex_) {
      this->leftIndex_ = 0;
      this->rightIndex_ = 0;
    }
    else {
      resetBuffer(this);
      uVar1 = size(that);
      this->capacity_ = uVar1;
      uVar3 = 0xffffffffffffffff;
      if (-1 < (long)uVar1) {
        uVar3 = uVar1;
      }
      __dest = (char *)operator_new__(uVar3);
      this->buffer_ = __dest;
      __src = data(that);
      __n = size(that);
      memcpy(__dest,__src,__n);
      this->leftIndex_ = 0;
      oVar2 = size(that);
      this->rightIndex_ = oVar2;
    }
  }
  return;
}

Assistant:

void Buffer::deepCopy(const Buffer &that) {
    if (this == &that)
        return;
    if(that.empty()) {
        retrieve();
        return;
    }
    resetBuffer();
    capacity_ = that.size() + defaultPrependSize;
    buffer_ = new char[capacity_];
    ::memcpy(buffer_ + defaultPrependSize, that.data(), that.size());
    leftIndex_ = defaultPrependSize;
    rightIndex_ = that.size() + defaultPrependSize;
}